

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_substring(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint end;
  uint start;
  int iVar1;
  JSValueUnion p;
  uint uVar2;
  JSValue v;
  JSValue JVar3;
  JSValue JVar4;
  int b;
  int a;
  uint local_3c;
  JSValueUnion local_38;
  uint local_2c;
  
  JVar3 = JS_ToStringCheckObject(ctx,this_val);
  p = JVar3.u;
  uVar2 = (uint)JVar3.tag;
  if (uVar2 != 6) {
    local_38 = p;
    iVar1 = JS_ToInt32Clamp(ctx,(int *)&local_2c,*argv,0,*(uint *)((long)p.ptr + 4) & 0x7fffffff,0);
    if (iVar1 == 0) {
      local_3c = *(uint *)((long)p.ptr + 4) & 0x7fffffff;
      if (((int)argv[1].tag == 3) ||
         (JVar4.tag = argv[1].tag, JVar4.u.ptr = argv[1].u.ptr,
         iVar1 = JS_ToInt32Clamp(ctx,(int *)&local_3c,JVar4,0,local_3c,0), iVar1 == 0)) {
        end = local_3c;
        if ((int)local_3c < (int)local_2c) {
          end = local_2c;
        }
        start = local_3c;
        if ((int)local_2c < (int)local_3c) {
          start = local_2c;
        }
        JVar4 = js_sub_string(ctx,(JSString *)p.ptr,start,end);
        if (uVar2 < 0xfffffff5) {
          return JVar4;
        }
        iVar1 = *local_38.ptr;
        *(int *)local_38.ptr = iVar1 + -1;
        if (1 < iVar1) {
          return JVar4;
        }
        v.tag = JVar3.tag;
        v.u.ptr = local_38.ptr;
        __JS_FreeValueRT(ctx->rt,v);
        return JVar4;
      }
    }
    if ((0xfffffff4 < uVar2) &&
       (iVar1 = *local_38.ptr, *(int *)local_38.ptr = iVar1 + -1, iVar1 < 2)) {
      JVar3.u.ptr = local_38.ptr;
      __JS_FreeValueRT(ctx->rt,JVar3);
    }
    JVar3 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar3;
}

Assistant:

static JSValue js_string_substring(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int a, b, start, end;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    if (JS_ToInt32Clamp(ctx, &a, argv[0], 0, p->len, 0)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    b = p->len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &b, argv[1], 0, p->len, 0)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    if (a < b) {
        start = a;
        end = b;
    } else {
        start = b;
        end = a;
    }
    ret = js_sub_string(ctx, p, start, end);
    JS_FreeValue(ctx, str);
    return ret;
}